

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA2.c
# Opt level: O1

Hacl_Streaming_Types_error_code
update_224_256(Hacl_Streaming_MD_state_32 *state,uint8_t *chunk,uint32_t chunk_len)

{
  uint32_t *puVar1;
  Hacl_Streaming_Types_error_code HVar2;
  uint8_t *puVar3;
  ulong uVar4;
  int iVar5;
  uint64_t uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint8_t *puVar12;
  uint8_t *b0;
  uint8_t *__src;
  bool bVar13;
  bool bVar14;
  uint8_t *b0_1;
  
  uVar11 = state->total_len;
  uVar4 = (ulong)chunk_len;
  HVar2 = '\x03';
  if (uVar4 <= 0x1fffffffffffffff - uVar11) {
    uVar8 = (uint)uVar11 & 0x3f;
    uVar9 = (ulong)uVar8;
    bVar13 = (uVar11 & 0x3f) == 0;
    bVar14 = uVar11 != 0;
    if (bVar14 && bVar13) {
      uVar8 = 0x40;
    }
    uVar10 = 0x40 - uVar8;
    uVar7 = chunk_len - uVar10;
    if (chunk_len < uVar10 || uVar7 == 0) {
      puVar1 = state->block_state;
      puVar12 = state->buf;
      if (bVar14 && bVar13) {
        uVar9 = 0x40;
      }
      memcpy(puVar12 + uVar9,chunk,uVar4);
      uVar6 = uVar11 + uVar4;
      state->block_state = puVar1;
      state->buf = puVar12;
    }
    else if (uVar8 == 0) {
      puVar1 = state->block_state;
      puVar12 = state->buf;
      if ((uVar9 == 0) == (bVar14 && bVar13)) {
        sha256_update(puVar12,puVar1);
      }
      uVar8 = 0x40;
      if ((chunk_len & 0x3f) != 0) {
        uVar8 = chunk_len & 0x3f;
      }
      uVar8 = chunk_len - uVar8;
      puVar3 = chunk + (uVar8 & 0xffffffc0);
      if (0x3f < uVar8) {
        uVar9 = (ulong)(uVar8 >> 6);
        do {
          sha256_update(chunk,puVar1);
          chunk = chunk + 0x40;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      memcpy(puVar12,puVar3,(ulong)(chunk_len - (uVar8 & 0xffffffc0)));
      uVar6 = uVar11 + uVar4;
      state->block_state = puVar1;
      state->buf = puVar12;
    }
    else {
      uVar4 = (ulong)uVar10;
      puVar12 = chunk + uVar4;
      puVar1 = state->block_state;
      puVar3 = state->buf;
      if (bVar14 && bVar13) {
        uVar9 = 0x40;
      }
      memcpy(puVar3 + uVar9,chunk,uVar4);
      state->block_state = puVar1;
      state->buf = puVar3;
      uVar6 = uVar11 + uVar4;
      state->total_len = uVar6;
      if (uVar6 != 0) {
        sha256_update(puVar3,puVar1);
      }
      uVar8 = 0x40;
      if ((uVar7 & 0x3f) != 0) {
        uVar8 = uVar7 & 0x3f;
      }
      iVar5 = chunk_len - uVar10;
      if (iVar5 == 0) {
        uVar8 = uVar7 & 0x3f;
      }
      uVar8 = iVar5 - uVar8;
      __src = puVar12 + (uVar8 & 0xffffffc0);
      if (0x3f < uVar8) {
        uVar11 = (ulong)(uVar8 >> 6);
        do {
          sha256_update(puVar12,puVar1);
          puVar12 = puVar12 + 0x40;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      memcpy(puVar3,__src,(ulong)(iVar5 - (uVar8 & 0xffffffc0)));
      uVar6 = uVar6 + uVar7;
      state->block_state = puVar1;
      state->buf = puVar3;
    }
    state->total_len = uVar6;
    HVar2 = '\0';
  }
  return HVar2;
}

Assistant:

static inline Hacl_Streaming_Types_error_code
update_224_256(Hacl_Streaming_MD_state_32 *state, uint8_t *chunk, uint32_t chunk_len)
{
  Hacl_Streaming_MD_state_32 s = *state;
  uint64_t total_len = s.total_len;
  if ((uint64_t)chunk_len > 2305843009213693951ULL - total_len)
  {
    return Hacl_Streaming_Types_MaximumLengthExceeded;
  }
  uint32_t sz;
  if (total_len % (uint64_t)64U == 0ULL && total_len > 0ULL)
  {
    sz = 64U;
  }
  else
  {
    sz = (uint32_t)(total_len % (uint64_t)64U);
  }
  if (chunk_len <= 64U - sz)
  {
    Hacl_Streaming_MD_state_32 s1 = *state;
    uint32_t *block_state1 = s1.block_state;
    uint8_t *buf = s1.buf;
    uint64_t total_len1 = s1.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)64U == 0ULL && total_len1 > 0ULL)
    {
      sz1 = 64U;
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)64U);
    }
    uint8_t *buf2 = buf + sz1;
    memcpy(buf2, chunk, chunk_len * sizeof (uint8_t));
    uint64_t total_len2 = total_len1 + (uint64_t)chunk_len;
    *state
    =
      (
        (Hacl_Streaming_MD_state_32){
          .block_state = block_state1,
          .buf = buf,
          .total_len = total_len2
        }
      );
  }
  else if (sz == 0U)
  {
    Hacl_Streaming_MD_state_32 s1 = *state;
    uint32_t *block_state1 = s1.block_state;
    uint8_t *buf = s1.buf;
    uint64_t total_len1 = s1.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)64U == 0ULL && total_len1 > 0ULL)
    {
      sz1 = 64U;
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)64U);
    }
    if (!(sz1 == 0U))
    {
      Hacl_Hash_SHA2_sha256_update_nblocks(64U, buf, block_state1);
    }
    uint32_t ite;
    if ((uint64_t)chunk_len % (uint64_t)64U == 0ULL && (uint64_t)chunk_len > 0ULL)
    {
      ite = 64U;
    }
    else
    {
      ite = (uint32_t)((uint64_t)chunk_len % (uint64_t)64U);
    }
    uint32_t n_blocks = (chunk_len - ite) / 64U;
    uint32_t data1_len = n_blocks * 64U;
    uint32_t data2_len = chunk_len - data1_len;
    uint8_t *data1 = chunk;
    uint8_t *data2 = chunk + data1_len;
    Hacl_Hash_SHA2_sha256_update_nblocks(data1_len / 64U * 64U, data1, block_state1);
    uint8_t *dst = buf;
    memcpy(dst, data2, data2_len * sizeof (uint8_t));
    *state
    =
      (
        (Hacl_Streaming_MD_state_32){
          .block_state = block_state1,
          .buf = buf,
          .total_len = total_len1 + (uint64_t)chunk_len
        }
      );
  }
  else
  {
    uint32_t diff = 64U - sz;
    uint8_t *chunk1 = chunk;
    uint8_t *chunk2 = chunk + diff;
    Hacl_Streaming_MD_state_32 s1 = *state;
    uint32_t *block_state10 = s1.block_state;
    uint8_t *buf0 = s1.buf;
    uint64_t total_len10 = s1.total_len;
    uint32_t sz10;
    if (total_len10 % (uint64_t)64U == 0ULL && total_len10 > 0ULL)
    {
      sz10 = 64U;
    }
    else
    {
      sz10 = (uint32_t)(total_len10 % (uint64_t)64U);
    }
    uint8_t *buf2 = buf0 + sz10;
    memcpy(buf2, chunk1, diff * sizeof (uint8_t));
    uint64_t total_len2 = total_len10 + (uint64_t)diff;
    *state
    =
      (
        (Hacl_Streaming_MD_state_32){
          .block_state = block_state10,
          .buf = buf0,
          .total_len = total_len2
        }
      );
    Hacl_Streaming_MD_state_32 s10 = *state;
    uint32_t *block_state1 = s10.block_state;
    uint8_t *buf = s10.buf;
    uint64_t total_len1 = s10.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)64U == 0ULL && total_len1 > 0ULL)
    {
      sz1 = 64U;
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)64U);
    }
    if (!(sz1 == 0U))
    {
      Hacl_Hash_SHA2_sha256_update_nblocks(64U, buf, block_state1);
    }
    uint32_t ite;
    if
    ((uint64_t)(chunk_len - diff) % (uint64_t)64U == 0ULL && (uint64_t)(chunk_len - diff) > 0ULL)
    {
      ite = 64U;
    }
    else
    {
      ite = (uint32_t)((uint64_t)(chunk_len - diff) % (uint64_t)64U);
    }
    uint32_t n_blocks = (chunk_len - diff - ite) / 64U;
    uint32_t data1_len = n_blocks * 64U;
    uint32_t data2_len = chunk_len - diff - data1_len;
    uint8_t *data1 = chunk2;
    uint8_t *data2 = chunk2 + data1_len;
    Hacl_Hash_SHA2_sha256_update_nblocks(data1_len / 64U * 64U, data1, block_state1);
    uint8_t *dst = buf;
    memcpy(dst, data2, data2_len * sizeof (uint8_t));
    *state
    =
      (
        (Hacl_Streaming_MD_state_32){
          .block_state = block_state1,
          .buf = buf,
          .total_len = total_len1 + (uint64_t)(chunk_len - diff)
        }
      );
  }
  return Hacl_Streaming_Types_Success;
}